

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCordFallback
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  size_t sVar5;
  uint uVar6;
  uint unaff_R12D;
  ulong uVar7;
  int unaff_R13D;
  int iVar8;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  char *local_48;
  
  iVar2 = (int)this->buffer_end_ - (int)ptr;
  if (this->zcis_ == (ZeroCopyInputStream *)0x0) {
    if (iVar2 + 0x10 < size) {
      iVar2 = BytesAvailable(this,ptr);
      uVar6 = size;
      do {
        size = uVar6 - iVar2;
        if (size == 0 || (int)uVar6 < iVar2) {
          ReadCordFallback((EpsCopyInputStream *)&stack0xffffffffffffffc0);
          goto LAB_002ae8e4;
        }
        if (this->next_chunk_ == (char *)0x0) {
          return (char *)0x0;
        }
        src_00._M_len = (size_t)iVar2;
        src_00._M_str = ptr;
        absl::lts_20250127::Cord::InlineRep::AppendArray(&cord->contents_,src_00,kAppendString);
        if (this->limit_ < 0x11) {
          return (char *)0x0;
        }
        pcVar3 = Next(this);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        ptr = pcVar3 + 0x10;
        iVar2 = BytesAvailable(this,ptr);
        uVar6 = size;
      } while (iVar2 < size);
      sVar5 = (size_t)size;
      src_01._M_str = ptr;
      src_01._M_len = sVar5;
      absl::lts_20250127::Cord::InlineRep::AppendArray(&cord->contents_,src_01,kAppendString);
    }
    else {
      sVar5 = (size_t)size;
      src_02._M_str = ptr;
      src_02._M_len = sVar5;
      absl::lts_20250127::Cord::operator=(cord,src_02);
    }
    return ptr + sVar5;
  }
  iVar8 = this->limit_ + iVar2;
  unaff_R13D = iVar8 - size;
  if (iVar8 < size) {
    return (char *)0x0;
  }
  unaff_R12D = iVar2 + 0x10;
  uVar7 = (ulong)unaff_R12D;
  local_48 = this->patch_buffer_;
  if ((int)unaff_R12D < 0x21 && (ulong)((long)ptr - (long)local_48) < 0x21) {
    if ((iVar2 == 0) && (this->next_chunk_ != local_48 && this->next_chunk_ != (char *)0x0)) {
      absl::lts_20250127::Cord::Clear(cord);
      uVar7 = (ulong)(uint)this->size_;
    }
    else {
      uVar6 = size - unaff_R12D;
      bVar1 = size < (int)unaff_R12D;
      size = uVar6;
      if (uVar6 == 0 || bVar1) {
LAB_002ae8e4:
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)size,0,"size > 0");
      }
      else {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_002ae904:
        ReadCordFallback();
      }
      src._M_len = (size_t)(int)unaff_R12D;
      src._M_str = ptr;
      absl::lts_20250127::Cord::operator=(cord,src);
      if (this->next_chunk_ == local_48) goto LAB_002ae85d;
      if (this->next_chunk_ == (char *)0x0) {
        this->last_tag_minus_1_ = 1;
        return (char *)0x0;
      }
      if (this->size_ < 0x11) {
        ReadCordFallback((EpsCopyInputStream *)&stack0xffffffffffffffc0);
        goto LAB_002ae904;
      }
      uVar7 = (ulong)(this->size_ - 0x10);
    }
  }
  else {
    absl::lts_20250127::Cord::Clear(cord);
  }
  (*this->zcis_->_vptr_ZeroCopyInputStream[3])(this->zcis_,uVar7);
  this->overall_limit_ = this->overall_limit_ + (int)uVar7;
LAB_002ae85d:
  if (size <= this->overall_limit_) {
    this->overall_limit_ = this->overall_limit_ - size;
    iVar2 = (*this->zcis_->_vptr_ZeroCopyInputStream[6])(this->zcis_,cord,(ulong)(uint)size);
    if ((char)iVar2 != '\0') {
      pcVar3 = InitFrom(this,this->zcis_);
      uVar6 = unaff_R13D + ((int)pcVar3 - (int)this->buffer_end_);
      this->limit_ = uVar6;
      this->limit_end_ = this->buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadCordFallback(const char* ptr, int size,
                                                 absl::Cord* cord) {
  if (zcis_ == nullptr) {
    int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
    if (size <= bytes_from_buffer) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return AppendSize(ptr, size, [cord](const char* p, int s) {
      cord->Append(absl::string_view(p, s));
    });
  }
  int new_limit = buffer_end_ - ptr + limit_;
  if (size > new_limit) return nullptr;
  new_limit -= size;
  int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
  const bool in_patch_buf = reinterpret_cast<uintptr_t>(ptr) -
                                reinterpret_cast<uintptr_t>(patch_buffer_) <=
                            kPatchBufferSize;
  if (bytes_from_buffer > kPatchBufferSize || !in_patch_buf) {
    cord->Clear();
    StreamBackUp(bytes_from_buffer);
  } else if (bytes_from_buffer == kSlopBytes && next_chunk_ != nullptr &&
             // Only backup if next_chunk_ points to a valid buffer returned by
             // ZeroCopyInputStream. This happens when NextStream() returns a
             // chunk that's smaller than or equal to kSlopBytes.
             next_chunk_ != patch_buffer_) {
    cord->Clear();
    StreamBackUp(size_);
  } else {
    size -= bytes_from_buffer;
    ABSL_DCHECK_GT(size, 0);
    *cord = absl::string_view(ptr, bytes_from_buffer);
    if (next_chunk_ == patch_buffer_) {
      // We have read to end of the last buffer returned by
      // ZeroCopyInputStream. So the stream is in the right position.
    } else if (next_chunk_ == nullptr) {
      // There is no remaining chunks. We can't read size.
      SetEndOfStream();
      return nullptr;
    } else {
      // Next chunk is already loaded
      ABSL_DCHECK(size_ > kSlopBytes);
      StreamBackUp(size_ - kSlopBytes);
    }
  }
  if (size > overall_limit_) return nullptr;
  overall_limit_ -= size;
  if (!zcis_->ReadCord(cord, size)) return nullptr;
  ptr = InitFrom(zcis_);
  limit_ = new_limit - static_cast<int>(buffer_end_ - ptr);
  limit_end_ = buffer_end_ + (std::min)(0, limit_);
  return ptr;
}